

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml.c
# Opt level: O1

PyObject * libxml_xmlSchemaFreeValidCtxt(PyObject *self,PyObject *args)

{
  long *plVar1;
  int iVar2;
  undefined8 uVar3;
  PyObject *pPVar4;
  xmlSchemaValidCtxtPyCtxtPtr pyCtxt;
  PyObject *pyobj_ctxt;
  undefined8 *local_20;
  undefined *local_18;
  
  pPVar4 = (PyObject *)0x0;
  iVar2 = _PyArg_ParseTuple_SizeT(args,"O:xmlSchemaFreeValidCtxt",&local_18);
  if (iVar2 != 0) {
    if (local_18 == &_Py_NoneStruct) {
      uVar3 = 0;
    }
    else {
      uVar3 = *(undefined8 *)(local_18 + 0x10);
    }
    iVar2 = xmlSchemaGetValidErrors(uVar3,0,0,&local_20);
    if (local_20 != (undefined8 *)0x0 && iVar2 == 0) {
      plVar1 = (long *)local_20[1];
      if ((plVar1 != (long *)0x0) && (*plVar1 = *plVar1 + -1, *plVar1 == 0)) {
        _Py_Dealloc();
      }
      plVar1 = (long *)*local_20;
      if ((plVar1 != (long *)0x0) && (*plVar1 = *plVar1 + -1, *plVar1 == 0)) {
        _Py_Dealloc();
      }
      plVar1 = (long *)local_20[2];
      if ((plVar1 != (long *)0x0) && (*plVar1 = *plVar1 + -1, *plVar1 == 0)) {
        _Py_Dealloc();
      }
      (*_xmlFree)(local_20);
    }
    xmlSchemaFreeValidCtxt(uVar3);
    pPVar4 = (PyObject *)&_Py_NoneStruct;
    __Py_NoneStruct = __Py_NoneStruct + 1;
  }
  return pPVar4;
}

Assistant:

static PyObject *
libxml_xmlSchemaFreeValidCtxt(ATTRIBUTE_UNUSED PyObject * self, PyObject * args)
{
	xmlSchemaValidCtxtPtr ctxt;
	xmlSchemaValidCtxtPyCtxtPtr pyCtxt;
	PyObject *pyobj_ctxt;

	if (!PyArg_ParseTuple(args, (char *)"O:xmlSchemaFreeValidCtxt", &pyobj_ctxt))
		return(NULL);
	ctxt = (xmlSchemaValidCtxtPtr) PySchemaValidCtxt_Get(pyobj_ctxt);

	if (xmlSchemaGetValidErrors(ctxt, NULL, NULL, (void **) &pyCtxt) == 0)
	{
		if (pyCtxt != NULL)
		{
			Py_XDECREF(pyCtxt->error);
			Py_XDECREF(pyCtxt->warn);
			Py_XDECREF(pyCtxt->arg);
			xmlFree(pyCtxt);
		}
	}

	xmlSchemaFreeValidCtxt(ctxt);
	Py_INCREF(Py_None);
	return(Py_None);
}